

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotor.cpp
# Opt level: O1

void __thiscall
chrono::ChShaftsMotor::IntToDescriptor
          (ChShaftsMotor *this,uint off_v,ChStateDelta *v,ChVectorDynamic<> *R,uint off_L,
          ChVectorDynamic<> *L,ChVectorDynamic<> *Qc)

{
  ulong uVar1;
  
  if (this->motor_mode == MOT_MODE_TORQUE) {
    return;
  }
  uVar1 = (ulong)off_L;
  if (((long)uVar1 <
       (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) &&
     ((this->constraint).super_ChConstraintTwo.super_ChConstraint.l_i =
           (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           [uVar1],
     (long)uVar1 <
     (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)) {
    (this->constraint).super_ChConstraintTwo.super_ChConstraint.b_i =
         (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
         [uVar1];
    return;
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

void ChShaftsMotor::IntToDescriptor(const unsigned int off_v,  // offset in v, R
                                    const ChStateDelta& v,
                                    const ChVectorDynamic<>& R,
                                    const unsigned int off_L,  // offset in L, Qc
                                    const ChVectorDynamic<>& L,
                                    const ChVectorDynamic<>& Qc) {
    if (motor_mode != MOT_MODE_TORQUE) {
        constraint.Set_l_i(L(off_L));

        constraint.Set_b_i(Qc(off_L));
    }
}